

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

void mg_set_handler_type(mg_context *phys_ctx,mg_domain_context *dom_ctx,char *uri,int handler_type,
                        int is_delete_request,mg_request_handler handler,
                        mg_websocket_subprotocols *subprotocols,
                        mg_websocket_connect_handler connect_handler,
                        mg_websocket_ready_handler ready_handler,
                        mg_websocket_data_handler data_handler,
                        mg_websocket_close_handler close_handler,
                        mg_authorization_handler auth_handler,void *cbdata)

{
  int iVar1;
  size_t sVar2;
  mg_handler_info *pmVar3;
  char *pcVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  undefined7 uVar9;
  undefined8 uVar8;
  char *extraout_RDX;
  char *extraout_RDX_00;
  mg_handler_info **ppmVar10;
  mg_context *ctx;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int local_78;
  int iStack_74;
  int local_70;
  int iStack_6c;
  int local_68;
  int iStack_64;
  int local_60;
  int iStack_5c;
  
  uVar7 = (ulong)(uint)handler_type;
  sVar2 = strlen(uri);
  iStack_64 = (int)((ulong)data_handler >> 0x20);
  iStack_5c = (int)((ulong)close_handler >> 0x20);
  iStack_74 = (int)((ulong)connect_handler >> 0x20);
  iStack_6c = (int)((ulong)ready_handler >> 0x20);
  local_68 = (int)data_handler;
  local_60 = (int)close_handler;
  local_78 = (int)connect_handler;
  local_70 = (int)ready_handler;
  if (handler_type == 1) {
    if (handler != (mg_request_handler)0x0) {
      return;
    }
    auVar12._0_4_ = -(uint)(local_78 == 0 && local_68 == 0);
    auVar12._4_4_ = -(uint)(iStack_74 == 0 && iStack_64 == 0);
    auVar12._8_4_ = -(uint)(local_70 == 0 && local_60 == 0);
    auVar12._12_4_ = -(uint)(iStack_6c == 0 && iStack_5c == 0);
    uVar6 = movmskps((int)uVar7,auVar12);
    uVar7 = (ulong)(uVar6 ^ 0xf);
    bVar11 = (uVar6 ^ 0xf) == 0;
LAB_0011e15d:
    uVar9 = (undefined7)(uVar7 >> 8);
    if (bVar11 && is_delete_request == 0 || auth_handler != (mg_authorization_handler)0x0) {
      return;
    }
  }
  else {
    if (handler_type != 2) {
      if (handler_type != 0) {
        return;
      }
      auVar13._0_4_ = -(uint)(local_78 == 0 && local_68 == 0);
      auVar13._4_4_ = -(uint)(iStack_74 == 0 && iStack_64 == 0);
      auVar13._8_4_ = -(uint)(local_70 == 0 && local_60 == 0);
      auVar13._12_4_ = -(uint)(iStack_6c == 0 && iStack_5c == 0);
      iVar1 = movmskps((int)sVar2,auVar13);
      if (iVar1 != 0xf) {
        return;
      }
      bVar11 = handler == (mg_request_handler)0x0;
      goto LAB_0011e15d;
    }
    if (handler != (mg_request_handler)0x0) {
      return;
    }
    auVar14._0_4_ = -(uint)(local_78 == 0 && local_68 == 0);
    auVar14._4_4_ = -(uint)(iStack_74 == 0 && iStack_64 == 0);
    auVar14._8_4_ = -(uint)(local_70 == 0 && local_60 == 0);
    auVar14._12_4_ = -(uint)(iStack_6c == 0 && iStack_5c == 0);
    iVar1 = movmskps((int)sVar2,auVar14);
    if (iVar1 != 0xf) {
      return;
    }
    uVar9 = (undefined7)(uVar7 >> 8);
    if (is_delete_request == 0 && auth_handler == (mg_authorization_handler)0x0) {
      return;
    }
  }
  bVar11 = dom_ctx == (mg_domain_context *)0x0 || phys_ctx == (mg_context *)0x0;
  uVar8 = CONCAT71(uVar9,bVar11);
  if (bVar11) {
    return;
  }
  mg_lock_context(phys_ctx);
  ppmVar10 = &dom_ctx->handlers;
  while( true ) {
    uVar6 = (uint)uVar8;
    pmVar3 = *ppmVar10;
    if (pmVar3 == (mg_handler_info *)0x0) break;
    if (((pmVar3->handler_type == handler_type) && (sVar2 == pmVar3->uri_len)) &&
       (iVar1 = strcmp(pmVar3->uri,uri), iVar1 == 0)) {
      if (is_delete_request == 0) {
        if (handler_type == 0) {
          if (pmVar3->refcount != 0) goto LAB_0011e210;
          lVar5 = 0x18;
        }
        else if (handler_type == 1) {
          pmVar3->subprotocols = subprotocols;
          pmVar3->connect_handler = connect_handler;
          pmVar3->ready_handler = ready_handler;
          pmVar3->data_handler = data_handler;
          lVar5 = 0x40;
          handler = (mg_request_handler)close_handler;
        }
        else {
          lVar5 = 0x50;
          handler = auth_handler;
        }
        *(mg_request_handler *)((long)&pmVar3->uri + lVar5) = handler;
        pmVar3->cbdata = cbdata;
        goto LAB_0011e2a6;
      }
      if ((handler_type != 0) || (pmVar3->refcount == 0)) {
        *ppmVar10 = pmVar3->next;
        free(pmVar3->uri);
        free(pmVar3);
        goto LAB_0011e2a6;
      }
      pmVar3->removing = 1;
LAB_0011e210:
      mg_unlock_context(phys_ctx);
      usleep(1000);
      mg_lock_context(phys_ctx);
      ppmVar10 = &dom_ctx->handlers;
    }
    else {
      ppmVar10 = &pmVar3->next;
    }
  }
  if (is_delete_request == 0) {
    ctx = (mg_context *)0x68;
    pmVar3 = (mg_handler_info *)calloc(1,0x68);
    if (pmVar3 == (mg_handler_info *)0x0) {
      mg_unlock_context(phys_ctx);
      pcVar4 = extraout_RDX;
    }
    else {
      pcVar4 = mg_strdup_ctx(uri,ctx);
      pmVar3->uri = pcVar4;
      if (pcVar4 != (char *)0x0) {
        lVar5 = 0x50;
        if (handler_type == 0) {
          auth_handler = handler;
          lVar5 = 0x18;
        }
        pmVar3->uri_len = sVar2;
        if (handler_type == 1) {
          pmVar3->subprotocols = subprotocols;
          pmVar3->connect_handler = connect_handler;
          pmVar3->ready_handler = ready_handler;
          pmVar3->data_handler = data_handler;
          lVar5 = 0x40;
          auth_handler = (mg_authorization_handler)close_handler;
        }
        *(mg_authorization_handler *)((long)&pmVar3->uri + lVar5) = auth_handler;
        pmVar3->cbdata = cbdata;
        pmVar3->handler_type = handler_type;
        *ppmVar10 = pmVar3;
        goto LAB_0011e2a6;
      }
      mg_unlock_context(phys_ctx);
      free(pmVar3);
      pcVar4 = extraout_RDX_00;
    }
    mg_cry_internal_wrap
              ((mg_connection *)0x0,phys_ctx,pcVar4,uVar6,"%s",
               "Cannot create new request handler struct, OOM");
    return;
  }
LAB_0011e2a6:
  mg_unlock_context(phys_ctx);
  return;
}

Assistant:

static void
mg_set_handler_type(struct mg_context *phys_ctx,
                    struct mg_domain_context *dom_ctx,
                    const char *uri,
                    int handler_type,
                    int is_delete_request,
                    mg_request_handler handler,
                    struct mg_websocket_subprotocols *subprotocols,
                    mg_websocket_connect_handler connect_handler,
                    mg_websocket_ready_handler ready_handler,
                    mg_websocket_data_handler data_handler,
                    mg_websocket_close_handler close_handler,
                    mg_authorization_handler auth_handler,
                    void *cbdata)
{
	struct mg_handler_info *tmp_rh, **lastref;
	size_t urilen = strlen(uri);

	if (handler_type == WEBSOCKET_HANDLER) {
		DEBUG_ASSERT(handler == NULL);
		DEBUG_ASSERT(is_delete_request || connect_handler != NULL
		             || ready_handler != NULL || data_handler != NULL
		             || close_handler != NULL);

		DEBUG_ASSERT(auth_handler == NULL);
		if (handler != NULL) {
			return;
		}
		if (!is_delete_request && (connect_handler == NULL)
		    && (ready_handler == NULL) && (data_handler == NULL)
		    && (close_handler == NULL)) {
			return;
		}
		if (auth_handler != NULL) {
			return;
		}

	} else if (handler_type == REQUEST_HANDLER) {
		DEBUG_ASSERT(connect_handler == NULL && ready_handler == NULL
		             && data_handler == NULL && close_handler == NULL);
		DEBUG_ASSERT(is_delete_request || (handler != NULL));
		DEBUG_ASSERT(auth_handler == NULL);

		if ((connect_handler != NULL) || (ready_handler != NULL)
		    || (data_handler != NULL) || (close_handler != NULL)) {
			return;
		}
		if (!is_delete_request && (handler == NULL)) {
			return;
		}
		if (auth_handler != NULL) {
			return;
		}

	} else if (handler_type == AUTH_HANDLER) {
		DEBUG_ASSERT(handler == NULL);
		DEBUG_ASSERT(connect_handler == NULL && ready_handler == NULL
		             && data_handler == NULL && close_handler == NULL);
		DEBUG_ASSERT(is_delete_request || (auth_handler != NULL));
		if (handler != NULL) {
			return;
		}
		if ((connect_handler != NULL) || (ready_handler != NULL)
		    || (data_handler != NULL) || (close_handler != NULL)) {
			return;
		}
		if (!is_delete_request && (auth_handler == NULL)) {
			return;
		}
	} else {
		/* Unknown handler type. */
		return;
	}

	if (!phys_ctx || !dom_ctx) {
		/* no context available */
		return;
	}

	mg_lock_context(phys_ctx);

	/* first try to find an existing handler */
	do {
		lastref = &(dom_ctx->handlers);
		for (tmp_rh = dom_ctx->handlers; tmp_rh != NULL;
		     tmp_rh = tmp_rh->next) {
			if (tmp_rh->handler_type == handler_type
			    && (urilen == tmp_rh->uri_len) && !strcmp(tmp_rh->uri, uri)) {
				if (!is_delete_request) {
					/* update existing handler */
					if (handler_type == REQUEST_HANDLER) {
						/* Wait for end of use before updating */
						if (tmp_rh->refcount) {
							mg_unlock_context(phys_ctx);
							mg_sleep(1);
							mg_lock_context(phys_ctx);
							/* tmp_rh might have been freed, search again. */
							break;
						}
						/* Ok, the handler is no more use -> Update it */
						tmp_rh->handler = handler;
					} else if (handler_type == WEBSOCKET_HANDLER) {
						tmp_rh->subprotocols = subprotocols;
						tmp_rh->connect_handler = connect_handler;
						tmp_rh->ready_handler = ready_handler;
						tmp_rh->data_handler = data_handler;
						tmp_rh->close_handler = close_handler;
					} else { /* AUTH_HANDLER */
						tmp_rh->auth_handler = auth_handler;
					}
					tmp_rh->cbdata = cbdata;
				} else {
					/* remove existing handler */
					if (handler_type == REQUEST_HANDLER) {
						/* Wait for end of use before removing */
						if (tmp_rh->refcount) {
							tmp_rh->removing = 1;
							mg_unlock_context(phys_ctx);
							mg_sleep(1);
							mg_lock_context(phys_ctx);
							/* tmp_rh might have been freed, search again. */
							break;
						}
						/* Ok, the handler is no more used */
					}
					*lastref = tmp_rh->next;
					mg_free(tmp_rh->uri);
					mg_free(tmp_rh);
				}
				mg_unlock_context(phys_ctx);
				return;
			}
			lastref = &(tmp_rh->next);
		}
	} while (tmp_rh != NULL);

	if (is_delete_request) {
		/* no handler to set, this was a remove request to a non-existing
		 * handler */
		mg_unlock_context(phys_ctx);
		return;
	}

	tmp_rh =
	    (struct mg_handler_info *)mg_calloc_ctx(1,
	                                            sizeof(struct mg_handler_info),
	                                            phys_ctx);
	if (tmp_rh == NULL) {
		mg_unlock_context(phys_ctx);
		mg_cry_ctx_internal(phys_ctx,
		                    "%s",
		                    "Cannot create new request handler struct, OOM");
		return;
	}
	tmp_rh->uri = mg_strdup_ctx(uri, phys_ctx);
	if (!tmp_rh->uri) {
		mg_unlock_context(phys_ctx);
		mg_free(tmp_rh);
		mg_cry_ctx_internal(phys_ctx,
		                    "%s",
		                    "Cannot create new request handler struct, OOM");
		return;
	}
	tmp_rh->uri_len = urilen;
	if (handler_type == REQUEST_HANDLER) {
		tmp_rh->refcount = 0;
		tmp_rh->removing = 0;
		tmp_rh->handler = handler;
	} else if (handler_type == WEBSOCKET_HANDLER) {
		tmp_rh->subprotocols = subprotocols;
		tmp_rh->connect_handler = connect_handler;
		tmp_rh->ready_handler = ready_handler;
		tmp_rh->data_handler = data_handler;
		tmp_rh->close_handler = close_handler;
	} else { /* AUTH_HANDLER */
		tmp_rh->auth_handler = auth_handler;
	}
	tmp_rh->cbdata = cbdata;
	tmp_rh->handler_type = handler_type;
	tmp_rh->next = NULL;

	*lastref = tmp_rh;
	mg_unlock_context(phys_ctx);
}